

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void function(FunctionType type)

{
  int iVar1;
  ObjFunction *pOVar2;
  uint8_t uVar3;
  long lVar4;
  Compiler compiler;
  Compiler CStack_2238;
  
  initCompiler(&CStack_2238,type);
  current->scopeDepth = current->scopeDepth + 1;
  if (parser.current.type == TOKEN_LEFT_PAREN) {
    advance();
  }
  else {
    errorAt(&parser.current,"Expect \'(\' after function name.");
  }
  if (parser.current.type != TOKEN_RIGHT_PAREN) {
    while( true ) {
      iVar1 = current->function->arity;
      current->function->arity = iVar1 + 1;
      if (0xfe < iVar1) {
        errorAt(&parser.current,"Cannot have more than 255 parameters.");
      }
      uVar3 = parseVariable("Expect parameter name.");
      defineVariable(uVar3);
      if (parser.current.type != TOKEN_COMMA) break;
      advance();
    }
  }
  if (parser.current.type == TOKEN_RIGHT_PAREN) {
    advance();
  }
  else {
    errorAt(&parser.current,"Expect \')\' after parameters.");
  }
  if (parser.current.type == TOKEN_LEFT_BRACE) {
    advance();
  }
  else {
    errorAt(&parser.current,"Expect \'{\' before function body.");
  }
  block();
  emitReturn();
  pOVar2 = current->function;
  current = current->enclosing;
  uVar3 = makeConstant((ulong)pOVar2 | 0xfffc000000000000);
  emitBytes('\x1f',uVar3);
  if (0 < pOVar2->upvalueCount) {
    lVar4 = 0;
    do {
      writeChunk(&current->function->chunk,CStack_2238.upvalues[lVar4].isLocal,parser.previous.line)
      ;
      writeChunk(&current->function->chunk,CStack_2238.upvalues[lVar4].index,parser.previous.line);
      lVar4 = lVar4 + 1;
    } while (lVar4 < pOVar2->upvalueCount);
  }
  return;
}

Assistant:

static void function(FunctionType type) {
    Compiler compiler;
    initCompiler(&compiler, type);
    beginScope();

    // Compile the parameter list.
    consume(TOKEN_LEFT_PAREN, "Expect '(' after function name.");

    //Parameter
    if (!check(TOKEN_RIGHT_PAREN)) {
        do {
            current->function->arity++;
            if (current->function->arity > PARAMS_MAX) {
                errorAtCurrent("Cannot have more than 255 parameters.");
            }

            uint8_t paramConstant = parseVariable("Expect parameter name.");
            defineVariable(paramConstant);
        } while (match(TOKEN_COMMA));
    }

    consume(TOKEN_RIGHT_PAREN, "Expect ')' after parameters.");

    // The body.
    consume(TOKEN_LEFT_BRACE, "Expect '{' before function body.");
    block();

    // Create the function object.
    ObjFunction* function = endCompiler();
    emitBytes(OP_CLOSURE, makeConstant(OBJ_VAL(function)));

    /*
     * if the first byte is one, it captures a local variable in the enclosing function.
     * If zero, it captures one of the function’s UpValues
     */
    for (int i = 0; i < function->upvalueCount; i++) {
        emitByte(compiler.upvalues[i].isLocal ? 1 : 0);
        emitByte(compiler.upvalues[i].index);
    }
}